

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O0

int StateCurPlayer(pyhanabi_state_t *state)

{
  int iVar1;
  long *in_RDI;
  
  if (in_RDI == (long *)0x0) {
    __assert_fail("state != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,0x150,"int StateCurPlayer(pyhanabi_state_t *)");
  }
  if (*in_RDI != 0) {
    iVar1 = hanabi_learning_env::HanabiState::CurPlayer((HanabiState *)*in_RDI);
    return iVar1;
  }
  __assert_fail("state->state != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                ,0x151,"int StateCurPlayer(pyhanabi_state_t *)");
}

Assistant:

int StateCurPlayer(pyhanabi_state_t* state) {
  REQUIRE(state != nullptr);
  REQUIRE(state->state != nullptr);
  return reinterpret_cast<hanabi_learning_env::HanabiState*>(state->state)
      ->CurPlayer();
}